

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O0

AssemblyCommands * __thiscall
AssemblyCode::PatternMatcher::GenerateCode
          (AssemblyCommands *__return_storage_ptr__,PatternMatcher *this,
          CStatementList *cStatementList)

{
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *this_00;
  size_type sVar1;
  const_reference this_01;
  INode *node;
  int local_64;
  undefined1 local_60 [4];
  int index;
  CTemp fakeDest;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *statements;
  CStatementList *cStatementList_local;
  PatternMatcher *this_local;
  AssemblyCommands *commands;
  
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = IRT::CStatementList::Statements(cStatementList);
  IRT::CTemp::CTemp((CTemp *)local_60);
  for (local_64 = 0;
      sVar1 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::size(this_00), (ulong)(long)local_64 < sVar1; local_64 = local_64 + 1) {
    this_01 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::operator[](this_00,(long)local_64);
    node = (INode *)std::
                    unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
                    get(this_01);
    GenerateCodeForNode(this,node,(CTemp *)local_60,__return_storage_ptr__);
  }
  IRT::CTemp::~CTemp((CTemp *)local_60);
  return __return_storage_ptr__;
}

Assistant:

AssemblyCommands AssemblyCode::PatternMatcher::GenerateCode( const IRT::CStatementList *cStatementList ) {
    AssemblyCommands commands;
    const std::vector<std::unique_ptr<const IRT::CStatement>> &statements = cStatementList->Statements( );
    IRT::CTemp fakeDest;
    for ( int index = 0; index < statements.size( ); ++index ) {
        GenerateCodeForNode( statements[ index ].get( ), fakeDest, commands );
    }
    return commands;
}